

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVertexTriangleAdjacency.cpp
# Opt level: O0

void __thiscall
VTAdjacencyTest_unreferencedVerticesSet_Test::TestBody
          (VTAdjacencyTest_unreferencedVerticesSet_Test *this)

{
  int iVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  aiFace *local_568;
  aiFace *face;
  int local_540;
  uint i;
  uint iCurrent;
  undefined1 local_530 [8];
  aiMesh mesh;
  VTAdjacencyTest_unreferencedVerticesSet_Test *this_local;
  
  mesh._1304_8_ = this;
  aiMesh::aiMesh((aiMesh *)local_530);
  local_530._4_4_ = 500;
  mesh.mPrimitiveTypes = 600;
  puVar2 = (undefined8 *)operator_new__(0x2588);
  *puVar2 = 600;
  mesh.mNumUVComponents._24_8_ = puVar2 + 1;
  local_568 = (aiFace *)mesh.mNumUVComponents._24_8_;
  do {
    aiFace::aiFace(local_568);
    local_568 = local_568 + 1;
  } while (local_568 != (aiFace *)(puVar2 + 0x4b1));
  local_540 = 0;
  for (face._4_4_ = 0; face._4_4_ < 600; face._4_4_ = face._4_4_ + 1) {
    puVar3 = (undefined4 *)(mesh.mNumUVComponents._24_8_ + (ulong)face._4_4_ * 0x10);
    *puVar3 = 3;
    pvVar4 = operator_new__(0xc);
    *(void **)(puVar3 + 2) = pvVar4;
    if (local_540 == 499) {
      local_540 = 0;
    }
    iVar1 = local_540 + 1;
    **(int **)(puVar3 + 2) = local_540;
    local_540 = iVar1;
    if (iVar1 == 499) {
      local_540 = 0;
    }
    iVar1 = local_540 + 1;
    *(int *)(*(long *)(puVar3 + 2) + 4) = local_540;
    local_540 = iVar1;
    if (iVar1 == 499) {
      local_540 = 0;
    }
    *(int *)(*(long *)(puVar3 + 2) + 8) = local_540;
    iVar1 = rand();
    if ((iVar1 < 0x40000000) || (**(int **)(puVar3 + 2) == 0)) {
      if (*(int *)(*(long *)(puVar3 + 2) + 4) != 0) {
        *(int *)(*(long *)(puVar3 + 2) + 4) = *(int *)(*(long *)(puVar3 + 2) + 4) + -1;
      }
    }
    else {
      **(int **)(puVar3 + 2) = **(int **)(puVar3 + 2) + -1;
    }
    local_540 = local_540 + 1;
  }
  VTAdjacencyTest::checkMesh(&this->super_VTAdjacencyTest,(aiMesh *)local_530);
  aiMesh::~aiMesh((aiMesh *)local_530);
  return;
}

Assistant:

TEST_F(VTAdjacencyTest, unreferencedVerticesSet)
{
    // build a test mesh which does not reference all vertices
    // *******************************************************************************
    aiMesh mesh;

    mesh.mNumVertices = 500;
    mesh.mNumFaces = 600;

    mesh.mFaces = new aiFace[600];
    unsigned int iCurrent = 0;
    for (unsigned int i = 0; i < 600;++i)
    {
        aiFace& face = mesh.mFaces[i];
        face.mNumIndices = 3;
        face.mIndices = new unsigned int[3];

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[0] = iCurrent++;

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[1] = iCurrent++;

        if (499 == iCurrent)iCurrent = 0;
        face.mIndices[2] = iCurrent++;

        if (rand() > RAND_MAX/2 && face.mIndices[0])
        {
            face.mIndices[0]--;
        }
        else if (face.mIndices[1]) face.mIndices[1]--;
    }

    checkMesh(mesh);
}